

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

void Bac_PtrDumpModuleVerilog(FILE *pFile,Vec_Ptr_t *vNtk)

{
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *vNtk_local;
  FILE *pFile_local;
  
  pvVar2 = Vec_PtrEntry(vNtk,0);
  fprintf((FILE *)pFile,"module %s (\n    ",pvVar2);
  pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,1);
  Bac_PtrDumpSignalsVerilog(pFile,pVVar3,1);
  pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,2);
  Bac_PtrDumpSignalsVerilog(pFile,pVVar3,0);
  fprintf((FILE *)pFile,"\n  );\n");
  fprintf((FILE *)pFile,"  input");
  pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,1);
  Bac_PtrDumpSignalsVerilog(pFile,pVVar3,0);
  fprintf((FILE *)pFile,";\n");
  fprintf((FILE *)pFile,"  output");
  pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,2);
  Bac_PtrDumpSignalsVerilog(pFile,pVVar3,0);
  fprintf((FILE *)pFile,";\n");
  pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,3);
  iVar1 = Vec_PtrSize(pVVar3);
  if (iVar1 == 0) {
    pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,4);
    Bac_PtrDumpBoxesVerilog(pFile,pVVar3);
    fprintf((FILE *)pFile,"endmodule\n\n");
    return;
  }
  __assert_fail("Vec_PtrSize((Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtr.c"
                ,0xfc,"void Bac_PtrDumpModuleVerilog(FILE *, Vec_Ptr_t *)");
}

Assistant:

void Bac_PtrDumpModuleVerilog( FILE * pFile, Vec_Ptr_t * vNtk )
{
    fprintf( pFile, "module %s (\n    ", (char *)Vec_PtrEntry(vNtk, 0) );
    Bac_PtrDumpSignalsVerilog( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1), 1 );
    Bac_PtrDumpSignalsVerilog( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2), 0 );
    fprintf( pFile, "\n  );\n" );
    fprintf( pFile, "  input" );
    Bac_PtrDumpSignalsVerilog( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1), 0 );
    fprintf( pFile, ";\n" );
    fprintf( pFile, "  output" );
    Bac_PtrDumpSignalsVerilog( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2), 0 );
    fprintf( pFile, ";\n" );
    assert( Vec_PtrSize((Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3)) == 0 ); // no nodes; only boxes
    Bac_PtrDumpBoxesVerilog( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4) );
    fprintf( pFile, "endmodule\n\n" );
}